

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O3

void __thiscall
TPZSBMatrix<std::complex<double>_>::AutoFill
          (TPZSBMatrix<std::complex<double>_> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double __z;
  double dVar8;
  double __z_00;
  double __z_01;
  double __z_02;
  double in_XMM1_Qa;
  double local_68;
  double dStack_60;
  double local_58 [3];
  undefined8 uStack_40;
  
  if (nrow != ncol || symmetric == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzsbndmat.cpp"
               ,0x34);
  }
  lVar6 = nrow + -1;
  if (0x12 < nrow + 9U) {
    lVar6 = nrow / 10;
  }
  this->fBand = lVar6;
  (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(this,nrow,ncol);
  local_68 = 0.0;
  dStack_60 = 0.0;
  lVar6 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar6) {
    lVar3 = 0;
    do {
      lVar4 = lVar3 + 1;
      lVar5 = this->fBand + lVar4;
      if (lVar6 <= lVar5) {
        lVar5 = lVar6;
      }
      dVar7 = 0.0;
      if (lVar3 != 0) {
        lVar6 = 0;
        do {
          (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar3,lVar6);
          dVar8 = cabs(__z);
          dVar7 = dVar7 + ABS(dVar8);
          lVar6 = lVar6 + 1;
          in_XMM1_Qa = dVar7;
        } while (lVar3 != lVar6);
      }
      if (lVar3 < lVar5) {
        lVar6 = 0;
        do {
          TPZMatrix<std::complex<double>_>::GetRandomVal
                    (&this->super_TPZMatrix<std::complex<double>_>);
          local_68 = __z_00;
          dStack_60 = in_XMM1_Qa;
          if (lVar6 == 0) {
            local_68 = cabs(__z_00);
            local_68 = ABS(local_68);
            dStack_60 = 0.0;
          }
          iVar2 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar3,lVar6 + lVar3,&local_68);
          if (iVar2 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"AutoFill (TPZMatrix) failed.",0x1c);
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzsbndmat.cpp"
                       ,0x50);
          }
          if (lVar6 != 0) {
            dVar8 = cabs(local_68);
            dVar7 = dVar7 + ABS(dVar8);
            in_XMM1_Qa = dVar7;
          }
          lVar1 = lVar6 + lVar3;
          lVar6 = lVar6 + 1;
        } while (lVar1 + 1 < lVar5);
      }
      if ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow ==
          (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
        local_58[2] = ABS(dVar7);
        uStack_40 = 0;
        (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(this,lVar3,lVar3);
        dVar8 = cabs(__z_01);
        if (ABS(dVar8) < local_58[2]) {
          local_58[0] = dVar7 + 1.0;
          local_58[1] = 0.0;
          (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(this,lVar3,lVar3,local_58);
        }
        in_XMM1_Qa = local_58[2];
        if (local_58[2] < 1e-12) {
          (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar3,lVar3);
          dVar7 = cabs(__z_02);
          in_XMM1_Qa = 1e-12;
          if (ABS(dVar7) < 1e-12) {
            local_58[0] = 1.0;
            local_58[1] = 0.0;
            (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(this,lVar3,lVar3,local_58);
          }
        }
      }
      lVar6 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
      lVar3 = lVar4;
    } while (lVar4 < lVar6);
  }
  return;
}

Assistant:

void TPZSBMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    if (nrow != ncol || symmetric == 0) {
        DebugStop();
    }
    fBand = nrow/10;
    if (fBand == 0) {
        fBand = nrow-1;
    }
    Resize(nrow, ncol);
    
    int64_t i, j;
    TVar val = 0, sum;
    /** Fill data */
    for(i=0;i<this->Rows();i++) {
        sum = 0.0;
        int64_t jmax = i+fBand+1;
        if (jmax >= this->Rows()) {
            jmax = this->Rows();
        }
        for (j=0; j<i; j++) {
            sum += fabs(GetVal(i, j));
        }
        for(j=i;j<jmax;j++) {
            val = this->GetRandomVal();
            if constexpr (is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(!PutVal(i,j,val))
            {
                std::cout << "AutoFill (TPZMatrix) failed.";
                DebugStop();
            }
            if(i!=j) sum += fabs(val);
        }
        if (this->Rows() == this->Cols()) {
            /** Making diagonally dominant and non zero in diagonal */
            if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
                PutVal(i,i,sum+(TVar)1.);
            // To sure diagonal is not zero.
            if(IsZero(sum) && IsZero(GetVal(i,i)))
                PutVal(i,i,1.);
        }
    }
    
}